

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_typeSlot_create
          (sysbvm_context_t *context,sysbvm_tuple_t owner,sysbvm_tuple_t name,sysbvm_tuple_t flags,
          sysbvm_tuple_t type,size_t localIndex,size_t index)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_typeSlot_t *result;
  size_t localIndex_local;
  sysbvm_tuple_t type_local;
  sysbvm_tuple_t flags_local;
  sysbvm_tuple_t name_local;
  sysbvm_tuple_t owner_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).typeSlotType,0xb);
  psVar1[1].field_1.pointers[0] = flags;
  psVar1[1].header.field_0.typePointer = owner;
  (psVar1->field_1).pointers[0] = name;
  psVar1[2].header.field_0.typePointer = type;
  sVar2 = sysbvm_tuple_size_encode(context,localIndex);
  psVar1[2].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,index);
  psVar1[3].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[3].header.identityHashAndFlags = (int)sVar2;
  psVar1[3].header.objectSize = (int)(sVar2 >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_typeSlot_create(sysbvm_context_t *context, sysbvm_tuple_t owner, sysbvm_tuple_t name, sysbvm_tuple_t flags, sysbvm_tuple_t type, size_t localIndex, size_t index)
{
    sysbvm_typeSlot_t* result = (sysbvm_typeSlot_t*)sysbvm_context_allocatePointerTuple(context, context->roots.typeSlotType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_typeSlot_t));
    result->flags = flags;
    result->super.owner = owner;
    result->super.name = name;
    result->type = type;
    result->localIndex = sysbvm_tuple_size_encode(context, localIndex);
    result->index = sysbvm_tuple_size_encode(context, index);
    result->offset = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}